

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O1

void rr::pa::TriangleStripAdjacency::
     exec<__gnu_cxx::__normal_iterator<rr::pa::TriangleAdjacency*,std::vector<rr::pa::TriangleAdjacency,std::allocator<rr::pa::TriangleAdjacency>>>>
               (__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                outputIterator,VertexPacket **vertices,size_t numVertices,
               ProvokingVertex provokingConvention)

{
  long lVar1;
  VertexPacket *pVVar2;
  int iVar3;
  VertexPacket **ppVVar4;
  VertexPacket *pVVar5;
  int iVar6;
  VertexPacket *pVVar7;
  TriangleAdjacency *pTVar8;
  ulong uVar9;
  ulong uVar10;
  VertexPacket **ppVVar11;
  VertexPacket *pVVar12;
  VertexPacket **ppVVar13;
  VertexPacket *pVVar14;
  VertexPacket **ppVVar15;
  VertexPacket **ppVVar16;
  VertexPacket **ppVVar17;
  
  if (5 < numVertices) {
    if (7 < numVertices) {
      pVVar2 = vertices[1];
      pVVar12 = vertices[2];
      pVVar14 = vertices[6];
      pVVar5 = vertices[4];
      pVVar7 = vertices[3];
      iVar3 = (uint)(provokingConvention != PROVOKINGVERTEX_FIRST) << 2;
      (outputIterator._M_current)->v0 = *vertices;
      (outputIterator._M_current)->v1 = pVVar2;
      (outputIterator._M_current)->v2 = pVVar12;
      (outputIterator._M_current)->v3 = pVVar14;
      (outputIterator._M_current)->v4 = pVVar5;
      (outputIterator._M_current)->v5 = pVVar7;
      (outputIterator._M_current)->provokingIndex = iVar3;
      pTVar8 = outputIterator._M_current + 1;
      uVar9 = 1;
      if (5 < numVertices - 4) {
        uVar9 = numVertices - 4 >> 1;
        uVar10 = 3;
        if (3 < uVar9) {
          uVar10 = uVar9;
        }
        ppVVar11 = vertices + 4;
        uVar9 = 1;
        do {
          outputIterator._M_current = pTVar8;
          if ((uVar9 & 1) == 0) {
            ppVVar13 = ppVVar11 + -2;
            ppVVar16 = ppVVar11 + 4;
            ppVVar4 = ppVVar11 + 1;
            ppVVar15 = ppVVar11;
            ppVVar17 = ppVVar13;
            iVar6 = iVar3;
          }
          else {
            ppVVar15 = vertices + uVar9 * 2;
            ppVVar13 = vertices + uVar9 * 2 + 2;
            ppVVar16 = vertices + uVar9 * 2 + 3;
            ppVVar4 = vertices + uVar9 * 2 + 6;
            ppVVar17 = ppVVar15;
            iVar6 = (uint)(provokingConvention != PROVOKINGVERTEX_FIRST) * 2 + 2;
          }
          pVVar12 = ppVVar17[-2];
          pVVar14 = ppVVar17[4];
          pVVar5 = *ppVVar16;
          pVVar7 = *ppVVar15;
          pVVar2 = *ppVVar4;
          (outputIterator._M_current)->v0 = *ppVVar13;
          (outputIterator._M_current)->v1 = pVVar12;
          (outputIterator._M_current)->v2 = pVVar7;
          (outputIterator._M_current)->v3 = pVVar5;
          (outputIterator._M_current)->v4 = pVVar14;
          (outputIterator._M_current)->v5 = pVVar2;
          (outputIterator._M_current)->provokingIndex = iVar6;
          pTVar8 = outputIterator._M_current + 1;
          lVar1 = uVar9 - uVar10;
          uVar9 = uVar9 + 1;
          ppVVar11 = ppVVar11 + 2;
        } while (lVar1 != -2);
      }
      if ((uVar9 & 1) == 0) {
        pVVar2 = vertices[uVar9 * 2 + -2];
        pVVar12 = vertices[uVar9 * 2 + 2];
        pVVar14 = vertices[uVar9 * 2 + 5];
        pVVar5 = vertices[uVar9 * 2 + 4];
        pVVar7 = vertices[uVar9 * 2 + 3];
        pTVar8->v0 = vertices[uVar9 * 2];
        outputIterator._M_current[1].v1 = pVVar2;
      }
      else {
        pVVar2 = vertices[uVar9 * 2 + -2];
        pVVar12 = vertices[uVar9 * 2];
        pVVar14 = vertices[uVar9 * 2 + 3];
        pVVar5 = vertices[uVar9 * 2 + 4];
        pVVar7 = vertices[uVar9 * 2 + 5];
        iVar3 = (uint)(provokingConvention != PROVOKINGVERTEX_FIRST) * 2 + 2;
        pTVar8->v0 = vertices[uVar9 * 2 + 2];
        outputIterator._M_current[1].v1 = pVVar2;
      }
      outputIterator._M_current[1].v2 = pVVar12;
      outputIterator._M_current[1].v3 = pVVar14;
      outputIterator._M_current[1].v4 = pVVar5;
      outputIterator._M_current[1].v5 = pVVar7;
      outputIterator._M_current[1].provokingIndex = iVar3;
      return;
    }
    pVVar2 = vertices[1];
    pVVar12 = vertices[2];
    pVVar14 = vertices[5];
    pVVar5 = vertices[4];
    pVVar7 = vertices[3];
    (outputIterator._M_current)->v0 = *vertices;
    (outputIterator._M_current)->v1 = pVVar2;
    (outputIterator._M_current)->v2 = pVVar12;
    (outputIterator._M_current)->v3 = pVVar14;
    (outputIterator._M_current)->v4 = pVVar5;
    (outputIterator._M_current)->v5 = pVVar7;
    (outputIterator._M_current)->provokingIndex =
         (uint)(provokingConvention != PROVOKINGVERTEX_FIRST) << 2;
  }
  return;
}

Assistant:

static void exec (Iterator outputIterator, VertexPacket* const* vertices, size_t numVertices, rr::ProvokingVertex provokingConvention)
	{
		if (numVertices < 6)
		{
		}
		else if (numVertices < 8)
		{
			*(outputIterator++) = TriangleAdjacency(vertices[0], vertices[1], vertices[2], vertices[5], vertices[4], vertices[3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
		}
		else
		{
			const size_t primitiveCount = getPrimitiveCount(numVertices);
			size_t i;

			// first
			*(outputIterator++) = TriangleAdjacency(vertices[0], vertices[1], vertices[2], vertices[6], vertices[4], vertices[3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));

			// middle
			for (i = 1; i + 1 < primitiveCount; ++i)
			{
				// odd
				if (i % 2 == 1)
				{
					*(outputIterator++) = TriangleAdjacency(vertices[2*i+2], vertices[2*i-2], vertices[2*i+0], vertices[2*i+3], vertices[2*i+4], vertices[2*i+6], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (2) : (4));
				}
				// even
				else
				{
					*(outputIterator++) = TriangleAdjacency(vertices[2*i+0], vertices[2*i-2], vertices[2*i+2], vertices[2*i+6], vertices[2*i+4], vertices[2*i+3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
				}
			}

			// last

			// odd
			if (i % 2 == 1)
				*(outputIterator++) = TriangleAdjacency(vertices[2*i+2], vertices[2*i-2], vertices[2*i+0], vertices[2*i+3], vertices[2*i+4], vertices[2*i+5], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (2) : (4));
			// even
			else
				*(outputIterator++) = TriangleAdjacency(vertices[2*i+0], vertices[2*i-2], vertices[2*i+2], vertices[2*i+5], vertices[2*i+4], vertices[2*i+3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
		}
	}